

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedStruct.hpp
# Opt level: O2

void __thiscall ParsedStruct::ParsedStruct(ParsedStruct *this,ParsedStruct *param_1)

{
  std::__cxx11::string::string((string *)this,(string *)param_1);
  std::__cxx11::string::string((string *)&this->havingCond,(string *)&param_1->havingCond);
  std::__cxx11::string::string((string *)&this->groupAttr,(string *)&param_1->groupAttr);
  std::__cxx11::string::string((string *)&this->aggFunc,(string *)&param_1->aggFunc);
  std::__cxx11::string::string((string *)&this->selectCondVect,(string *)&param_1->selectCondVect);
  return;
}

Assistant:

ParsedStruct(const ParsedStruct&) = default;